

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

MatchProperties __thiscall cmFileCopier::CollectMatchProperties(cmFileCopier *this,string *file)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  MatchRule *mr;
  pointer this_00;
  uint uVar5;
  
  pMVar1 = (this->MatchRules).
           super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = 0;
  uVar5 = 0;
  bVar3 = false;
  for (this_00 = (this->MatchRules).
                 super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pMVar1; this_00 = this_00 + 1
      ) {
    bVar2 = cmsys::RegularExpression::find(&this_00->Regex,file);
    if (bVar2) {
      bVar4 = bVar4 | (this_00->Properties).Exclude;
      uVar5 = uVar5 | (this_00->Properties).Permissions;
      bVar3 = true;
    }
  }
  if ((!bVar3) && (this->MatchlessFiles == false)) {
    bVar3 = cmsys::SystemTools::FileIsDirectory(file);
    bVar4 = !bVar3;
  }
  return (MatchProperties)((ulong)bVar4 | (ulong)uVar5 << 0x20);
}

Assistant:

cmFileCopier::MatchProperties cmFileCopier::CollectMatchProperties(
  const std::string& file)
{
  // Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
  const std::string file_to_match = cmSystemTools::LowerCase(file);
#else
  const std::string& file_to_match = file;
#endif

  // Collect properties from all matching rules.
  bool matched = false;
  MatchProperties result;
  for (MatchRule& mr : this->MatchRules) {
    if (mr.Regex.find(file_to_match)) {
      matched = true;
      result.Exclude |= mr.Properties.Exclude;
      result.Permissions |= mr.Properties.Permissions;
    }
  }
  if (!matched && !this->MatchlessFiles) {
    result.Exclude = !cmSystemTools::FileIsDirectory(file);
  }
  return result;
}